

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

TVariableType __thiscall
Refal2::CVariablesBuilder::checkTypeTag
          (CVariablesBuilder *this,TVariableTypeTag type,CQualifier **defaultQualifierForTag)

{
  CQualifier *pCVar1;
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  CQualifier **local_28;
  CQualifier **defaultQualifierForTag_local;
  CVariablesBuilder *pCStack_18;
  TVariableTypeTag type_local;
  CVariablesBuilder *this_local;
  
  local_28 = defaultQualifierForTag;
  defaultQualifierForTag_local._7_1_ = type;
  pCStack_18 = this;
  switch(type) {
  case 'E':
  case 'e':
    this_local._4_4_ = VT_E;
    break;
  case 'F':
  case 'f':
    if (defaultQualifierForTag != (CQualifier **)0x0) {
      pCVar1 = getDefaultQualifierForF();
      *local_28 = pCVar1;
    }
    warningObsoleteVariableType(this,'f',"s(F)_");
    this_local._4_4_ = VT_S;
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,1,type,&local_89);
    std::operator+((char *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "variable type `");
    std::operator+(local_48,(char *)local_68);
    error(this,local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    this_local._4_4_ = VT_None;
    break;
  case 'N':
  case 'n':
    if (defaultQualifierForTag != (CQualifier **)0x0) {
      pCVar1 = getDefaultQualifierForN();
      *local_28 = pCVar1;
    }
    warningObsoleteVariableType(this,'n',"s(N)_");
    this_local._4_4_ = VT_S;
    break;
  case 'S':
  case 's':
    this_local._4_4_ = VT_S;
    break;
  case 'V':
  case 'v':
    this_local._4_4_ = VT_V;
    break;
  case 'W':
  case 'w':
    this_local._4_4_ = VT_W;
  }
  return this_local._4_4_;
}

Assistant:

TVariableType CVariablesBuilder::checkTypeTag( const TVariableTypeTag type,
	const CQualifier** defaultQualifierForTag )
{
	switch( type ) {
		case 's':
		case 'S':
			return VT_S;
		case 'w':
		case 'W':
			return VT_W;
		case 'v':
		case 'V':
			return VT_V;
		case 'e':
		case 'E':
			return VT_E;
		case 'n':
		case 'N':
			if( defaultQualifierForTag != nullptr ) {
				*defaultQualifierForTag = getDefaultQualifierForN();
			}
			warningObsoleteVariableType( 'n', "s(N)_" );
			return VT_S;
		case 'f':
		case 'F':
			if( defaultQualifierForTag != nullptr ) {
				*defaultQualifierForTag = getDefaultQualifierForF();
			}
			warningObsoleteVariableType( 'f', "s(F)_" );
			return VT_S;
	}
	error( "variable type `"
		+ std::string( 1, static_cast<char>( type ) )
		+ "` doesn't exist, allowed variables types: `s`, `w`, `v` or `e`" );
	return VT_None;
}